

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O0

int init_traditional_pkware_encryption(archive_write *a)

{
  void *pvVar1;
  int iVar2;
  char *__s;
  size_t pw_len;
  uint8_t local_40 [4];
  int ret;
  uint8_t key_encrypted [12];
  uint8_t key [12];
  char *passphrase;
  zip_conflict *zip;
  archive_write *a_local;
  
  pvVar1 = a->format_data;
  __s = __archive_write_get_passphrase(a);
  if (__s == (char *)0x0) {
    archive_set_error(&a->archive,-1,"Encryption needs passphrase");
    a_local._4_4_ = -0x19;
  }
  else {
    iVar2 = archive_random(key_encrypted + 4,0xb);
    if (iVar2 == 0) {
      pw_len = strlen(__s);
      trad_enc_init((trad_enc_ctx *)((long)pvVar1 + 0x50),__s,pw_len);
      trad_enc_encrypt_update
                ((trad_enc_ctx *)((long)pvVar1 + 0x50),key_encrypted + 4,0xc,local_40,0xc);
      a_local._4_4_ = __archive_write_output(a,local_40,0xc);
      if (a_local._4_4_ == 0) {
        *(long *)((long)pvVar1 + 0xb0) = *(long *)((long)pvVar1 + 0xb0) + 0xc;
        *(long *)((long)pvVar1 + 0x18) = *(long *)((long)pvVar1 + 0x18) + 0xc;
      }
    }
    else {
      archive_set_error(&a->archive,-1,"Can\'t generate random number for encryption");
      a_local._4_4_ = -0x1e;
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
init_traditional_pkware_encryption(struct archive_write *a)
{
	struct zip *zip = a->format_data;
	const char *passphrase;
	uint8_t key[TRAD_HEADER_SIZE];
	uint8_t key_encrypted[TRAD_HEADER_SIZE];
	int ret;

	passphrase = __archive_write_get_passphrase(a);
	if (passphrase == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Encryption needs passphrase");
		return ARCHIVE_FAILED;
	}
	if (archive_random(key, sizeof(key)-1) != ARCHIVE_OK) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Can't generate random number for encryption");
		return ARCHIVE_FATAL;
	}
	trad_enc_init(&zip->tctx, passphrase, strlen(passphrase));
	/* Set the last key code which will be used as a check code
	 * for verifying passphrase in decryption. */
	key[TRAD_HEADER_SIZE-1] = zip->trad_chkdat;
	trad_enc_encrypt_update(&zip->tctx, key, TRAD_HEADER_SIZE,
	    key_encrypted, TRAD_HEADER_SIZE);
	/* Write encrypted keys in the top of the file content. */
	ret = __archive_write_output(a, key_encrypted, TRAD_HEADER_SIZE);
	if (ret != ARCHIVE_OK)
		return (ret);
	zip->written_bytes += TRAD_HEADER_SIZE;
	zip->entry_compressed_written += TRAD_HEADER_SIZE;
	return (ret);
}